

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

string * __thiscall pbrt::SpotLight::ToString_abi_cxx11_(SpotLight *this)

{
  string *in_RDI;
  LightBase *in_stack_ffffffffffffff98;
  float *args_3;
  float *in_stack_ffffffffffffffc0;
  DenselySampledSpectrum *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  args_3 = (float *)&stack0xffffffffffffffd0;
  LightBase::BaseToString_abi_cxx11_(in_stack_ffffffffffffff98);
  StringPrintf<std::__cxx11::string,pbrt::DenselySampledSpectrum_const&,float_const&,float_const&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,args_3);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

std::string SpotLight::ToString() const {
    return StringPrintf("[ SpotLight %s I: %s cosFalloffStart: %f cosFalloffEnd: %f ]",
                        BaseToString(), I, cosFalloffStart, cosFalloffEnd);
}